

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmap.cpp
# Opt level: O3

void __thiscall QPixmap::QPixmap(QPixmap *this,char **xpm)

{
  QPlatformPixmap *pQVar1;
  QExplicitlySharedDataPointer<QPlatformPixmap> QVar2;
  bool bVar3;
  long in_FS_OFFSET;
  QPixmap local_80;
  undefined1 local_68 [16];
  QImageData *local_58;
  undefined1 local_48 [16];
  QExplicitlySharedDataPointer<QPlatformPixmap> local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QPaintDevice::QPaintDevice(&this->super_QPaintDevice);
  (this->super_QPaintDevice)._vptr_QPaintDevice = (_func_int **)&PTR__QPixmap_007d25a8;
  (this->data).d.ptr = (QPlatformPixmap *)0x0;
  if (xpm != (char **)0x0) {
    local_58 = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
    local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QImage::QImage((QImage *)local_68,xpm);
    bVar3 = QImage::isNull((QImage *)local_68);
    if (!bVar3) {
      pQVar1 = (this->data).d.ptr;
      if ((pQVar1 == (QPlatformPixmap *)0x0) || (pQVar1->type != BitmapType)) {
        fromImageInPlace(&local_80,(QImage *)local_68,(ImageConversionFlags)0x0);
        local_38.d.ptr = (totally_ordered_wrapper<QPlatformPixmap_*>)&DAT_aaaaaaaaaaaaaaaa;
        local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QPaintDevice::QPaintDevice((QPaintDevice *)local_48);
        QVar2.d.ptr = local_80.data.d.ptr;
        local_48._0_8_ = &PTR__QPixmap_007d25a8;
        local_80.data.d.ptr = (totally_ordered_wrapper<QPlatformPixmap_*>)(QPlatformPixmap *)0x0;
        local_38.d.ptr = (totally_ordered_wrapper<QPlatformPixmap_*>)(this->data).d.ptr;
        (this->data).d.ptr = (QPlatformPixmap *)QVar2.d.ptr;
        ~QPixmap((QPixmap *)local_48);
        ~QPixmap(&local_80);
      }
      else {
        QBitmap::fromImage((QBitmap *)&local_80,(QImage *)local_68,(ImageConversionFlags)0x0);
        local_38.d.ptr = (totally_ordered_wrapper<QPlatformPixmap_*>)&DAT_aaaaaaaaaaaaaaaa;
        local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QPaintDevice::QPaintDevice((QPaintDevice *)local_48);
        QVar2.d.ptr = local_80.data.d.ptr;
        local_48._0_8_ = &PTR__QPixmap_007d25a8;
        local_80.data.d.ptr = (totally_ordered_wrapper<QPlatformPixmap_*>)(QPlatformPixmap *)0x0;
        local_38.d.ptr = (totally_ordered_wrapper<QPlatformPixmap_*>)(this->data).d.ptr;
        (this->data).d.ptr = (QPlatformPixmap *)QVar2.d.ptr;
        ~QPixmap((QPixmap *)local_48);
        QBitmap::~QBitmap((QBitmap *)&local_80);
      }
    }
    QImage::~QImage((QImage *)local_68);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QPixmap::QPixmap(const char * const xpm[])
    : QPaintDevice()
{
    doInit(0, 0, QPlatformPixmap::PixmapType);
    if (!xpm)
        return;

    QImage image(xpm);
    if (!image.isNull()) {
        if (data && data->pixelType() == QPlatformPixmap::BitmapType)
            *this = QBitmap::fromImage(std::move(image));
        else
            *this = fromImage(std::move(image));
    }
}